

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void * bc_trie_lookup(bc_trie_t *trie,char *key)

{
  _bc_trie_node_t *p_Var1;
  
  if ((trie != (bc_trie_t *)0x0) &&
     (p_Var1 = trie->root, key != (char *)0x0 && p_Var1 != (bc_trie_node_t *)0x0)) {
    while (p_Var1 != (bc_trie_node_t *)0x0) {
      if (p_Var1->key == *key) {
        if (p_Var1->key == '\0') {
          return p_Var1->data;
        }
        p_Var1 = p_Var1->child;
        key = key + 1;
      }
      else {
        p_Var1 = p_Var1->next;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void*
bc_trie_lookup(bc_trie_t *trie, const char *key)
{
    if (trie == NULL || trie->root == NULL || key == NULL)
        return NULL;

    bc_trie_node_t *parent = trie->root;
    bc_trie_node_t *tmp;
    while (1) {
        for (tmp = parent; tmp != NULL; tmp = tmp->next) {

            if (tmp->key == *key) {
                if (tmp->key == '\0')
                    return tmp->data;
                parent = tmp->child;
                break;
            }
        }
        if (tmp == NULL)
            return NULL;

        if (*key == '\0')
            break;
        key++;
    }
    return NULL;
}